

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config-c.cpp
# Opt level: O3

duckdb_state duckdb_set_config(duckdb_config config,char *name,char *option)

{
  size_t sVar1;
  duckdb_state dVar2;
  string local_88;
  Value local_68;
  
  dVar2 = DuckDBError;
  if (option != (char *)0x0 && (name != (char *)0x0 && config != (duckdb_config)0x0)) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    sVar1 = strlen(name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,name,name + sVar1);
    duckdb::Value::Value(&local_68,option);
    duckdb::DBConfig::SetOptionByName((DBConfig *)config,&local_88,&local_68);
    duckdb::Value::~Value(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    dVar2 = DuckDBSuccess;
  }
  return dVar2;
}

Assistant:

duckdb_state duckdb_set_config(duckdb_config config, const char *name, const char *option) {
	if (!config || !name || !option) {
		return DuckDBError;
	}

	try {
		auto db_config = (DBConfig *)config;
		db_config->SetOptionByName(name, Value(option));
	} catch (...) {
		return DuckDBError;
	}
	return DuckDBSuccess;
}